

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,JointType type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  void *pvVar11;
  double *v5;
  ulong uVar12;
  SpatialVector_t *pSVar13;
  ostream *poVar14;
  RBDLError *this_00;
  string *text;
  undefined8 uVar15;
  void *pvVar16;
  int in_ESI;
  undefined8 *in_RDI;
  ostringstream errormsg_1;
  ostringstream errormsg;
  SpatialVector_t *in_stack_fffffffffffff3e0;
  string *in_stack_fffffffffffff3f8;
  RBDLError *in_stack_fffffffffffff400;
  void *local_bd0;
  double *in_stack_fffffffffffff438;
  double *in_stack_fffffffffffff440;
  double *in_stack_fffffffffffff448;
  SpatialVector_t *in_stack_fffffffffffff450;
  SpatialVector_t *in_stack_fffffffffffff458;
  SpatialVector_t *in_stack_fffffffffffff460;
  double *in_stack_fffffffffffff470;
  void *local_b70;
  void *local_b40;
  void *local_b10;
  void *local_ae0;
  void *local_ab0;
  void *local_a80;
  void *local_a50;
  ostringstream local_a00 [383];
  undefined1 local_881;
  ostringstream local_860 [376];
  SpatialVector_t local_6e8 [2];
  SpatialVector_t local_688 [2];
  SpatialVector_t local_628 [2];
  SpatialVector_t local_5c8 [2];
  SpatialVector_t local_568 [2];
  SpatialVector_t local_508 [2];
  SpatialVector_t local_4a8 [2];
  SpatialVector_t local_448 [2];
  SpatialVector_t local_3e8 [2];
  SpatialVector_t local_388 [2];
  SpatialVector_t local_328 [2];
  SpatialVector_t local_2c8 [2];
  SpatialVector_t local_268 [2];
  SpatialVector_t local_208 [2];
  SpatialVector_t local_1a8 [2];
  SpatialVector_t local_148 [2];
  SpatialVector_t local_e8 [2];
  SpatialVector_t local_88 [2];
  
  *in_RDI = 0;
  *(int *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0xffffffff;
  if (in_ESI == 3) {
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12;
    uVar10 = SUB168(auVar1 * ZEXT816(0x30),0);
    if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_a50 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x847565);
        local_a50 = (void *)((long)local_a50 + 0x30);
      } while (local_a50 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_88[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 1.0;
    local_88[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_88[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_88[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_88[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_88[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_88;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 4) {
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar12;
    uVar10 = SUB168(auVar2 * ZEXT816(0x30),0);
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_a80 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x84771d);
        local_a80 = (void *)((long)local_a80 + 0x30);
      } while (local_a80 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 1.0;
    local_e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_e8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 5) {
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar12;
    uVar10 = SUB168(auVar3 * ZEXT816(0x30),0);
    if (SUB168(auVar3 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_ab0 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x8478d5);
        local_ab0 = (void *)((long)local_ab0 + 0x30);
      } while (local_ab0 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_148[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_148[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_148[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 1.0;
    local_148[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_148[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_148[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_148;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 6) {
    *(undefined4 *)((long)in_RDI + 0xc) = 3;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar12;
    uVar10 = SUB168(auVar4 * ZEXT816(0x30),0);
    if (SUB168(auVar4 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_ae0 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x847a8d);
        local_ae0 = (void *)((long)local_ae0 + 0x30);
      } while (local_ae0 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_1a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_1a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_1a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 1.0;
    local_1a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_1a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_1a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_1a8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_208[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_208[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 1.0;
    local_208[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_208[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_208[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_208[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_208;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_268[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 1.0;
    local_268[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_268[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_268[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_268[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_268[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_268;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 7) {
    *(undefined4 *)((long)in_RDI + 0xc) = 3;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar12;
    uVar10 = SUB168(auVar5 * ZEXT816(0x30),0);
    if (SUB168(auVar5 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_b10 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x847d99);
        local_b10 = (void *)((long)local_b10 + 0x30);
      } while (local_b10 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_2c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_2c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_2c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 1.0;
    local_2c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_2c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_2c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_2c8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_328[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_328[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 1.0;
    local_328[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_328[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_328[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_328[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_328;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_388[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 1.0;
    local_388[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_388[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_388[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_388[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_388[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_388;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 8) {
    *(undefined4 *)((long)in_RDI + 0xc) = 3;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar12;
    uVar10 = SUB168(auVar6 * ZEXT816(0x30),0);
    if (SUB168(auVar6 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_b40 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x8480a5);
        local_b40 = (void *)((long)local_b40 + 0x30);
      } while (local_b40 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_3e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 1.0;
    local_3e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_3e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_3e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_3e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_3e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_3e8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_448[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_448[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 1.0;
    local_448[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_448[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_448[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_448[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_448;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_4a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_4a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_4a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 1.0;
    local_4a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_4a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_4a8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_4a8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 9) {
    *(undefined4 *)((long)in_RDI + 0xc) = 3;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar12;
    uVar10 = SUB168(auVar7 * ZEXT816(0x30),0);
    if (SUB168(auVar7 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    if (uVar12 != 0) {
      local_b70 = pvVar11;
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x8483b1);
        local_b70 = (void *)((long)local_b70 + 0x30);
      } while (local_b70 != (void *)((long)pvVar11 + uVar12 * 0x30));
    }
    *in_RDI = pvVar11;
    local_508[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_508[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 1.0;
    local_508[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_508[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_508[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_508[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_508;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_568[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 1.0;
    local_568[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_568[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_568[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_568[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_568[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_568;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_5c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_5c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_5c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 1.0;
    local_5c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_5c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_5c8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_5c8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff470);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if (in_ESI == 10) {
    *(undefined4 *)((long)in_RDI + 0xc) = 3;
    v5 = (double *)CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = v5;
    uVar12 = SUB168(auVar8 * ZEXT816(0x30),0);
    if (SUB168(auVar8 * ZEXT816(0x30),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    pSVar13 = (SpatialVector_t *)operator_new__(uVar12);
    if (v5 != (double *)0x0) {
      in_stack_fffffffffffff458 = pSVar13 + (long)v5;
      in_stack_fffffffffffff460 = pSVar13;
      do {
        in_stack_fffffffffffff450 = in_stack_fffffffffffff460;
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x8486ba);
        in_stack_fffffffffffff460 = in_stack_fffffffffffff450 + 1;
      } while (in_stack_fffffffffffff460 != in_stack_fffffffffffff458);
    }
    *in_RDI = pSVar13;
    local_628[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_628[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_628[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_628[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 1.0;
    local_628[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_628[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_628;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,v5);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_688[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_688[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_688[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_688[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_688[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 1.0;
    local_688[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar13 = local_688;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,v5);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
    local_6e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_6e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_6e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_6e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_6e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_6e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 1.0;
    pSVar13 = local_6e8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458,
               (double *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               in_stack_fffffffffffff440,in_stack_fffffffffffff438,v5);
    SpatialVector_t::operator=(in_stack_fffffffffffff3e0,pSVar13);
  }
  else if ((in_ESI < 0xe) || (0x13 < in_ESI)) {
    if (in_ESI == 0x14) {
      std::__cxx11::ostringstream::ostringstream(local_860);
      poVar14 = std::operator<<((ostream *)local_860,
                                "Error: Invalid use of Joint constructor Joint(JointType");
      poVar14 = std::operator<<(poVar14," type). Only allowed when type != JointTypeCustom");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
      local_881 = 1;
      this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      Errors::RBDLError::RBDLError(this_00,in_stack_fffffffffffff3f8);
      local_881 = 0;
      __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    if ((in_ESI != 0xc) && (in_ESI != 0xb)) {
      std::__cxx11::ostringstream::ostringstream(local_a00);
      text = (string *)
             std::operator<<((ostream *)local_a00,
                             "Error: Invalid use of Joint constructor Joint(JointType type). Only allowed when type == JointTypeFixed or JointTypeSpherical."
                            );
      std::ostream::operator<<(text,std::endl<char,std::char_traits<char>>);
      uVar15 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      Errors::RBDLError::RBDLError(in_stack_fffffffffffff400,text);
      __cxa_throw(uVar15,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  else {
    *(int *)((long)in_RDI + 0xc) = in_ESI + -0xd;
    uVar12 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar12;
    uVar10 = SUB168(auVar9 * ZEXT816(0x30),0);
    if (SUB168(auVar9 * ZEXT816(0x30),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    local_bd0 = operator_new__(uVar10);
    pvVar11 = local_bd0;
    if (uVar12 != 0) {
      pvVar16 = (void *)((long)local_bd0 + uVar12 * 0x30);
      do {
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x8489bc);
        local_bd0 = (void *)((long)local_bd0 + 0x30);
      } while (local_bd0 != pvVar16);
    }
    *in_RDI = pvVar11;
    poVar14 = std::operator<<((ostream *)&std::cerr,"Warning: uninitalized vector");
    std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

Joint (JointType type) :
    mJointAxes (NULL),
    mJointType (type),
    mDoFCount (0),
    q_index (0),
    custom_joint_index(-1)
  {
    if (type == JointTypeRevoluteX) {
      mDoFCount = 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      mJointAxes[0] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
    } else if (type == JointTypeRevoluteY) {
      mDoFCount = 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      mJointAxes[0] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
    } else if (type == JointTypeRevoluteZ) {
      mDoFCount = 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      mJointAxes[0] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
    } else if (type == JointTypeSpherical) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
    } else if (type == JointTypeEulerZYX) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
    } else if (type == JointTypeEulerXYZ) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
    } else if (type == JointTypeEulerYXZ) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
    } else if (type == JointTypeTranslationXYZ) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 0., 0., 1., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 0., 0., 0., 1., 0.);
      mJointAxes[2] = Math::SpatialVector (0., 0., 0., 0., 0., 1.);
    } else if (type >= JointType1DoF && type <= JointType6DoF) {
      // create a joint and allocate memory for it.
      // Warning: the memory does not get initialized by this function!
      mDoFCount = type - JointType1DoF + 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      std::cerr << "Warning: uninitalized vector" << std::endl;
    } else if (type == JointTypeCustom) {
      //This constructor cannot be used for a JointTypeCustom because
      //we have no idea what mDoFCount is.
      std::ostringstream errormsg;
      errormsg  << "Error: Invalid use of Joint constructor Joint(JointType"
                << " type). Only allowed when type != JointTypeCustom"
                << std::endl;
      throw Errors::RBDLError(errormsg.str());
    } else if (type != JointTypeFixed && type != JointTypeFloatingBase) {
      std::ostringstream errormsg;
      errormsg <<
               "Error: Invalid use of Joint constructor Joint(JointType type). Only allowed when type == JointTypeFixed or JointTypeSpherical."
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
  }